

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5RowidCmp(Fts5Expr *pExpr,i64 iLhs,i64 iRhs)

{
  i64 iRhs_local;
  i64 iLhs_local;
  Fts5Expr *pExpr_local;
  uint local_4;
  
  if (pExpr->bDesc == 0) {
    if (iLhs < iRhs) {
      local_4 = 0xffffffff;
    }
    else {
      local_4 = (uint)(iRhs < iLhs);
    }
  }
  else if (iRhs < iLhs) {
    local_4 = 0xffffffff;
  }
  else {
    local_4 = (uint)(iLhs < iRhs);
  }
  return local_4;
}

Assistant:

static int fts5RowidCmp(
  Fts5Expr *pExpr,
  i64 iLhs,
  i64 iRhs
){
  assert( pExpr->bDesc==0 || pExpr->bDesc==1 );
  if( pExpr->bDesc==0 ){
    if( iLhs<iRhs ) return -1;
    return (iLhs > iRhs);
  }else{
    if( iLhs>iRhs ) return -1;
    return (iLhs < iRhs);
  }
}